

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O0

int32_t __thiscall
icu_63::DecimalFormat::getAttribute
          (DecimalFormat *this,UNumberFormatAttribute attr,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  UErrorCode *status_local;
  UNumberFormatAttribute attr_local;
  DecimalFormat *this_local;
  
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    if (attr == UNUM_PARSE_INT_ONLY) {
      UVar1 = NumberFormat::isParseIntegerOnly(&this->super_NumberFormat);
      this_local._4_4_ = (UCurrencyUsage)UVar1;
    }
    else if (attr == UNUM_GROUPING_USED) {
      UVar1 = NumberFormat::isGroupingUsed(&this->super_NumberFormat);
      this_local._4_4_ = (UCurrencyUsage)UVar1;
    }
    else if (attr == UNUM_DECIMAL_ALWAYS_SHOWN) {
      UVar1 = isDecimalSeparatorAlwaysShown(this);
      this_local._4_4_ = (UCurrencyUsage)UVar1;
    }
    else if (attr == UNUM_MAX_INTEGER_DIGITS) {
      this_local._4_4_ = NumberFormat::getMaximumIntegerDigits(&this->super_NumberFormat);
    }
    else if (attr == UNUM_MIN_INTEGER_DIGITS) {
      this_local._4_4_ = NumberFormat::getMinimumIntegerDigits(&this->super_NumberFormat);
    }
    else if (attr == UNUM_INTEGER_DIGITS) {
      this_local._4_4_ = NumberFormat::getMinimumIntegerDigits(&this->super_NumberFormat);
    }
    else if (attr == UNUM_MAX_FRACTION_DIGITS) {
      this_local._4_4_ = NumberFormat::getMaximumFractionDigits(&this->super_NumberFormat);
    }
    else if (attr == UNUM_MIN_FRACTION_DIGITS) {
      this_local._4_4_ = NumberFormat::getMinimumFractionDigits(&this->super_NumberFormat);
    }
    else if (attr == UNUM_FRACTION_DIGITS) {
      this_local._4_4_ = NumberFormat::getMinimumFractionDigits(&this->super_NumberFormat);
    }
    else if (attr == UNUM_MULTIPLIER) {
      this_local._4_4_ = getMultiplier(this);
    }
    else if (attr == UNUM_GROUPING_SIZE) {
      this_local._4_4_ = getGroupingSize(this);
    }
    else if (attr == UNUM_ROUNDING_MODE) {
      this_local._4_4_ =
           (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x22])();
    }
    else if (attr == UNUM_FORMAT_WIDTH) {
      this_local._4_4_ =
           (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x36])();
    }
    else if (attr == UNUM_PADDING_POSITION) {
      this_local._4_4_ =
           (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x3a])();
    }
    else if (attr == UNUM_SECONDARY_GROUPING_SIZE) {
      this_local._4_4_ = getSecondaryGroupingSize(this);
    }
    else if (attr == UNUM_SIGNIFICANT_DIGITS_USED) {
      UVar1 = areSignificantDigitsUsed(this);
      this_local._4_4_ = (UCurrencyUsage)UVar1;
    }
    else if (attr == UNUM_MIN_SIGNIFICANT_DIGITS) {
      this_local._4_4_ = getMinimumSignificantDigits(this);
    }
    else if (attr == UNUM_MAX_SIGNIFICANT_DIGITS) {
      this_local._4_4_ = getMaximumSignificantDigits(this);
    }
    else if (attr == UNUM_LENIENT_PARSE) {
      iVar2 = (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x19])();
      this_local._4_4_ = (UCurrencyUsage)(char)iVar2;
    }
    else if (attr == UNUM_SCALE) {
      this_local._4_4_ = getMultiplierScale(this);
    }
    else if (attr == UNUM_MINIMUM_GROUPING_DIGITS) {
      this_local._4_4_ = getMinimumGroupingDigits(this);
    }
    else if (attr == UNUM_CURRENCY_USAGE) {
      this_local._4_4_ = getCurrencyUsage(this);
    }
    else if (attr == UNUM_FORMAT_FAIL_IF_MORE_THAN_MAX_DIGITS) {
      iVar2 = (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x4b])();
      this_local._4_4_ = (UCurrencyUsage)(char)iVar2;
    }
    else if (attr == UNUM_PARSE_NO_EXPONENT) {
      iVar2 = (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x47])();
      this_local._4_4_ = (UCurrencyUsage)(char)iVar2;
    }
    else if (attr == UNUM_PARSE_DECIMAL_MARK_REQUIRED) {
      UVar1 = isDecimalPatternMatchRequired(this);
      this_local._4_4_ = (UCurrencyUsage)UVar1;
    }
    else if (attr == UNUM_PARSE_CASE_SENSITIVE) {
      iVar2 = (*(this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[0x49])();
      this_local._4_4_ = (UCurrencyUsage)(char)iVar2;
    }
    else if (attr == UNUM_SIGN_ALWAYS_SHOWN) {
      UVar1 = isSignAlwaysShown(this);
      this_local._4_4_ = (UCurrencyUsage)UVar1;
    }
    else {
      *status = U_UNSUPPORTED_ERROR;
      this_local._4_4_ = ~UCURR_USAGE_STANDARD;
    }
  }
  else {
    this_local._4_4_ = ~UCURR_USAGE_STANDARD;
  }
  return this_local._4_4_;
}

Assistant:

int32_t DecimalFormat::getAttribute(UNumberFormatAttribute attr, UErrorCode& status) const {
    if (U_FAILURE(status)) { return -1; }
    switch (attr) {
        case UNUM_LENIENT_PARSE:
            return isLenient();

        case UNUM_PARSE_INT_ONLY:
            return isParseIntegerOnly();

        case UNUM_GROUPING_USED:
            return isGroupingUsed();

        case UNUM_DECIMAL_ALWAYS_SHOWN:
            return isDecimalSeparatorAlwaysShown();

        case UNUM_MAX_INTEGER_DIGITS:
            return getMaximumIntegerDigits();

        case UNUM_MIN_INTEGER_DIGITS:
            return getMinimumIntegerDigits();

        case UNUM_INTEGER_DIGITS:
            // TBD: what should this return?
            return getMinimumIntegerDigits();

        case UNUM_MAX_FRACTION_DIGITS:
            return getMaximumFractionDigits();

        case UNUM_MIN_FRACTION_DIGITS:
            return getMinimumFractionDigits();

        case UNUM_FRACTION_DIGITS:
            // TBD: what should this return?
            return getMinimumFractionDigits();

        case UNUM_SIGNIFICANT_DIGITS_USED:
            return areSignificantDigitsUsed();

        case UNUM_MAX_SIGNIFICANT_DIGITS:
            return getMaximumSignificantDigits();

        case UNUM_MIN_SIGNIFICANT_DIGITS:
            return getMinimumSignificantDigits();

        case UNUM_MULTIPLIER:
            return getMultiplier();

        case UNUM_SCALE:
            return getMultiplierScale();

        case UNUM_GROUPING_SIZE:
            return getGroupingSize();

        case UNUM_ROUNDING_MODE:
            return getRoundingMode();

        case UNUM_FORMAT_WIDTH:
            return getFormatWidth();

        case UNUM_PADDING_POSITION:
            return getPadPosition();

        case UNUM_SECONDARY_GROUPING_SIZE:
            return getSecondaryGroupingSize();

        case UNUM_PARSE_NO_EXPONENT:
            return isParseNoExponent();

        case UNUM_PARSE_DECIMAL_MARK_REQUIRED:
            return isDecimalPatternMatchRequired();

        case UNUM_CURRENCY_USAGE:
            return getCurrencyUsage();

        case UNUM_MINIMUM_GROUPING_DIGITS:
            return getMinimumGroupingDigits();

        case UNUM_PARSE_CASE_SENSITIVE:
            return isParseCaseSensitive();

        case UNUM_SIGN_ALWAYS_SHOWN:
            return isSignAlwaysShown();

        case UNUM_FORMAT_FAIL_IF_MORE_THAN_MAX_DIGITS:
            return isFormatFailIfMoreThanMaxDigits();

        default:
            status = U_UNSUPPORTED_ERROR;
            break;
    }

    return -1; /* undefined */
}